

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

void __thiscall xLearn::Solver::StartWork(Solver *this)

{
  ostream *poVar1;
  Logger local_5c;
  string local_58;
  string local_38;
  
  if ((this->hyper_param_).is_train == true) {
    local_5c.severity_ = INFO;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
               ,"");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"StartWork","");
    poVar1 = Logger::Start(INFO,&local_38,0x20b,&local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Start training work.",0x14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    Logger::~Logger(&local_5c);
    start_train_work(this);
  }
  else {
    local_5c.severity_ = INFO;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
               ,"");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"StartWork","");
    poVar1 = Logger::Start(INFO,&local_38,0x20e,&local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Start inference work.",0x15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    Logger::~Logger(&local_5c);
    start_prediction_work(this);
  }
  return;
}

Assistant:

void Solver::StartWork() {
  if (hyper_param_.is_train) {
    LOG(INFO) << "Start training work.";
    start_train_work();
  } else {
    LOG(INFO) << "Start inference work.";
    start_prediction_work();
  }
}